

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O0

bool cmAddLibraryCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  pointer *this;
  string *tgtName;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  cmMakefile *pcVar6;
  reference input;
  reference pbVar7;
  long lVar8;
  size_type sVar9;
  cmTarget *pcVar10;
  cmState *this_00;
  char *local_a48;
  byte local_a19;
  bool local_9e9;
  byte local_921;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_801;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_800;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7f8;
  undefined1 local_7f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  cmAlphaNum local_7a8;
  string local_778;
  undefined1 local_758 [8];
  string msg;
  string local_730;
  cmAlphaNum local_710;
  cmAlphaNum local_6e0;
  string local_6b0;
  cmAlphaNum local_690;
  cmAlphaNum local_660;
  string local_630;
  allocator<char> local_609;
  string local_608;
  cmAlphaNum local_5e8;
  cmAlphaNum local_5b8;
  string local_588;
  byte local_563;
  byte local_562;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  cmAlphaNum local_518;
  cmAlphaNum local_4e8;
  string local_4b8;
  TargetType local_494;
  undefined1 local_490 [4];
  TargetType aliasedType;
  cmAlphaNum local_460;
  string local_430;
  cmTarget *local_410;
  cmTarget *aliasedTarget;
  cmAlphaNum local_3d8;
  string local_3a8;
  string *local_388;
  string *aliasedName;
  cmAlphaNum local_350;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  bool local_262;
  allocator<char> local_261;
  undefined1 local_260 [6];
  bool nameOk;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  uint local_100;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string libType;
  bool isAlias;
  bool haveSpecifiedType;
  string *libName;
  const_iterator s;
  undefined1 local_90 [4];
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  string *local_70;
  TargetType local_64;
  cmMakefile *pcStack_60;
  TargetType type;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    local_64 = SHARED_LIBRARY;
    pcStack_60 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"BUILD_SHARED_LIBS",(allocator<char> *)((long)&s._M_current + 7));
    local_70 = (string *)cmMakefile::GetDefinition(pcVar6,(string *)local_90);
    bVar2 = cmIsOff((cmValue)local_70);
    std::__cxx11::string::~string((string *)local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s._M_current + 7));
    if (bVar2) {
      local_64 = STATIC_LIBRARY;
    }
    s._M_current._6_1_ = 0;
    s._M_current._5_1_ = 0;
    s._M_current._4_1_ = 0;
    libName = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
    input = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&libName);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&libName);
    bVar2 = false;
    bVar4 = false;
    do {
      libType.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libType.field_2 + 8));
      if (!bVar3) goto LAB_0035feec;
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&libName);
      std::__cxx11::string::string((string *)local_d8,(string *)pbVar7);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"STATIC");
      pcVar1 = local_20;
      if (bVar3) {
        if (local_64 != INTERFACE_LIBRARY) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&libName);
          local_64 = STATIC_LIBRARY;
          bVar2 = true;
          goto LAB_0035fe9b;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"INTERFACE library specified with conflicting STATIC type.",
                   &local_f9);
        cmExecutionStatus::SetError(pcVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        args_local._7_1_ = 0;
        local_100 = 1;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d8,"SHARED");
        pcVar1 = local_20;
        if (bVar3) {
          if (local_64 != INTERFACE_LIBRARY) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName);
            local_64 = SHARED_LIBRARY;
            bVar2 = true;
            goto LAB_0035fe9b;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,
                     "INTERFACE library specified with conflicting SHARED type.",&local_121);
          cmExecutionStatus::SetError(pcVar1,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          args_local._7_1_ = 0;
          local_100 = 1;
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,"MODULE");
          pcVar1 = local_20;
          if (bVar3) {
            if (local_64 != INTERFACE_LIBRARY) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&libName);
              local_64 = MODULE_LIBRARY;
              bVar2 = true;
              goto LAB_0035fe9b;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,
                       "INTERFACE library specified with conflicting MODULE type.",&local_149);
            cmExecutionStatus::SetError(pcVar1,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator(&local_149);
            args_local._7_1_ = 0;
            local_100 = 1;
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8,"OBJECT");
            pcVar1 = local_20;
            if (bVar3) {
              if (local_64 != INTERFACE_LIBRARY) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&libName);
                local_64 = OBJECT_LIBRARY;
                bVar2 = true;
                goto LAB_0035fe9b;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_170,
                         "INTERFACE library specified with conflicting OBJECT type.",&local_171);
              cmExecutionStatus::SetError(pcVar1,&local_170);
              std::__cxx11::string::~string((string *)&local_170);
              std::allocator<char>::~allocator(&local_171);
              args_local._7_1_ = 0;
              local_100 = 1;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d8,"UNKNOWN");
              pcVar1 = local_20;
              if (bVar3) {
                if (local_64 != INTERFACE_LIBRARY) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&libName);
                  local_64 = UNKNOWN_LIBRARY;
                  bVar2 = true;
                  goto LAB_0035fe9b;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_198,
                           "INTERFACE library specified with conflicting UNKNOWN type.",&local_199);
                cmExecutionStatus::SetError(pcVar1,&local_198);
                std::__cxx11::string::~string((string *)&local_198);
                std::allocator<char>::~allocator(&local_199);
                args_local._7_1_ = 0;
                local_100 = 1;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d8,"ALIAS");
                pcVar1 = local_20;
                if (bVar3) {
                  if (local_64 != INTERFACE_LIBRARY) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libName);
                    bVar4 = true;
                    goto LAB_0035fe9b;
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c0,
                             "INTERFACE library specified with conflicting ALIAS type.",&local_1c1);
                  cmExecutionStatus::SetError(pcVar1,&local_1c0);
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::allocator<char>::~allocator(&local_1c1);
                  args_local._7_1_ = 0;
                  local_100 = 1;
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d8,"INTERFACE");
                  pcVar1 = local_20;
                  if (bVar3) {
                    if (bVar2) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1e8,
                                 "INTERFACE library specified with conflicting/multiple types.",
                                 &local_1e9);
                      cmExecutionStatus::SetError(pcVar1,&local_1e8);
                      std::__cxx11::string::~string((string *)&local_1e8);
                      std::allocator<char>::~allocator(&local_1e9);
                      args_local._7_1_ = 0;
                      local_100 = 1;
                    }
                    else {
                      if (!bVar4) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&libName);
                        local_64 = INTERFACE_LIBRARY;
                        bVar2 = true;
                        goto LAB_0035fe9b;
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_210,
                                 "INTERFACE library specified with conflicting ALIAS type.",
                                 &local_211);
                      cmExecutionStatus::SetError(pcVar1,&local_210);
                      std::__cxx11::string::~string((string *)&local_210);
                      std::allocator<char>::~allocator(&local_211);
                      args_local._7_1_ = 0;
                      local_100 = 1;
                    }
                  }
                  else {
                    pbVar7 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&libName);
                    bVar3 = std::operator==(pbVar7,"EXCLUDE_FROM_ALL");
                    if (bVar3) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&libName);
                      s._M_current._6_1_ = 1;
                    }
                    else {
                      pbVar7 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&libName);
                      bVar3 = std::operator==(pbVar7,"IMPORTED");
                      if (!bVar3) {
                        if ((s._M_current._5_1_ & 1) != 0) {
                          pbVar7 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&libName);
                          bVar3 = std::operator==(pbVar7,"GLOBAL");
                          if (bVar3) {
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&libName);
                            s._M_current._4_1_ = 1;
                            goto LAB_0035fe9b;
                          }
                        }
                        if (local_64 == INTERFACE_LIBRARY) {
                          pbVar7 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&libName);
                          bVar3 = std::operator==(pbVar7,"GLOBAL");
                          pcVar1 = local_20;
                          if (bVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_238,
                                       "GLOBAL option may only be used with IMPORTED libraries.",
                                       &local_239);
                            cmExecutionStatus::SetError(pcVar1,&local_238);
                            std::__cxx11::string::~string((string *)&local_238);
                            std::allocator<char>::~allocator(&local_239);
                            args_local._7_1_ = 0;
                            local_100 = 1;
                            goto LAB_0035fea5;
                          }
                        }
                        local_100 = 3;
                        goto LAB_0035fea5;
                      }
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&libName);
                      s._M_current._5_1_ = 1;
                    }
LAB_0035fe9b:
                    local_100 = 0;
                  }
                }
              }
            }
          }
        }
      }
LAB_0035fea5:
      std::__cxx11::string::~string((string *)local_d8);
    } while (local_100 == 0);
    if (local_100 != 1) {
LAB_0035feec:
      if (((s._M_current._5_1_ & 1) != 0) && ((s._M_current._4_1_ & 1) == 0)) {
        s._M_current._4_1_ = cmMakefile::IsImportedTargetGlobalScope(pcStack_60);
      }
      pcVar1 = local_20;
      if (((local_64 == INTERFACE_LIBRARY) && ((s._M_current._4_1_ & 1) != 0)) &&
         ((s._M_current._5_1_ & 1) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_260,"INTERFACE library specified as GLOBAL, but not as IMPORTED."
                   ,&local_261);
        cmExecutionStatus::SetError(pcVar1,(string *)local_260);
        std::__cxx11::string::~string((string *)local_260);
        std::allocator<char>::~allocator(&local_261);
        args_local._7_1_ = 0;
      }
      else {
        bVar3 = cmGeneratorExpression::IsValidTargetName(input);
        local_921 = 0;
        if (bVar3) {
          bVar3 = cmGlobalGenerator::IsReservedTarget(input);
          local_921 = bVar3 ^ 0xff;
        }
        local_262 = (bool)(local_921 & 1);
        if (((local_262 != false) && ((s._M_current._5_1_ & 1) == 0)) && (!bVar4)) {
          lVar8 = std::__cxx11::string::find((char)input,0x3a);
          local_262 = lVar8 == -1;
        }
        if ((local_262 != false) ||
           (bVar3 = cmMakefile::CheckCMP0037(pcStack_60,input,local_64), bVar3)) {
          pcVar1 = local_20;
          if (bVar4) {
            bVar2 = cmGeneratorExpression::IsValidTargetName(input);
            pcVar1 = local_20;
            if (bVar2) {
              if ((s._M_current._6_1_ & 1) == 0) {
                if (((s._M_current._5_1_ & 1) == 0) && ((s._M_current._4_1_ & 1) == 0)) {
                  sVar9 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)status_local);
                  pcVar1 = local_20;
                  if (sVar9 == 3) {
                    PVar5 = cmMakefile::GetPolicyStatus(pcStack_60,CMP0107,false);
                    if ((PVar5 == NEW) &&
                       (pcVar10 = cmMakefile::FindTargetToUse(pcStack_60,input,false),
                       pcVar1 = local_20, pcVar10 != (cmTarget *)0x0)) {
                      cmAlphaNum::cmAlphaNum(&local_350,"cannot create ALIAS target \"");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&aliasedName,input);
                      cmStrCat<char[60]>(&local_320,&local_350,(cmAlphaNum *)&aliasedName,
                                         (char (*) [60])
                                         "\" because another target with the same name already exists."
                                        );
                      cmExecutionStatus::SetError(pcVar1,&local_320);
                      std::__cxx11::string::~string((string *)&local_320);
                      args_local._7_1_ = 0;
                    }
                    else {
                      local_388 = __gnu_cxx::
                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&libName);
                      bVar2 = cmMakefile::IsAlias(pcStack_60,local_388);
                      pcVar1 = local_20;
                      if (bVar2) {
                        cmAlphaNum::cmAlphaNum(&local_3d8,"cannot create ALIAS target \"");
                        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&aliasedTarget,input);
                        cmStrCat<char[19],std::__cxx11::string,char[22]>
                                  (&local_3a8,&local_3d8,(cmAlphaNum *)&aliasedTarget,
                                   (char (*) [19])"\" because target \"",local_388,
                                   (char (*) [22])"\" is itself an ALIAS.");
                        cmExecutionStatus::SetError(pcVar1,&local_3a8);
                        std::__cxx11::string::~string((string *)&local_3a8);
                        args_local._7_1_ = 0;
                      }
                      else {
                        local_410 = cmMakefile::FindTargetToUse(pcStack_60,local_388,true);
                        pcVar1 = local_20;
                        if (local_410 == (cmTarget *)0x0) {
                          cmAlphaNum::cmAlphaNum(&local_460,"cannot create ALIAS target \"");
                          cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_490,input);
                          cmStrCat<char[19],std::__cxx11::string,char[26]>
                                    (&local_430,&local_460,(cmAlphaNum *)local_490,
                                     (char (*) [19])"\" because target \"",local_388,
                                     (char (*) [26])"\" does not already exist.");
                          cmExecutionStatus::SetError(pcVar1,&local_430);
                          std::__cxx11::string::~string((string *)&local_430);
                          args_local._7_1_ = 0;
                        }
                        else {
                          local_494 = cmTarget::GetType(local_410);
                          if (((((local_494 == SHARED_LIBRARY) || (local_494 == STATIC_LIBRARY)) ||
                               (local_494 == MODULE_LIBRARY)) ||
                              ((local_494 == OBJECT_LIBRARY || (local_494 == INTERFACE_LIBRARY))))
                             || ((local_494 == UNKNOWN_LIBRARY &&
                                 (bVar2 = cmTarget::IsImported(local_410), bVar2)))) {
                            pcVar6 = pcStack_60;
                            tgtName = local_388;
                            bVar2 = cmTarget::IsImported(local_410);
                            local_9e9 = true;
                            if (bVar2) {
                              local_9e9 = cmTarget::IsImportedGloballyVisible(local_410);
                            }
                            cmMakefile::AddAlias(pcVar6,input,tgtName,local_9e9);
                            args_local._7_1_ = 1;
                          }
                          else {
                            pcVar1 = local_20;
                            cmAlphaNum::cmAlphaNum(&local_4e8,"cannot create ALIAS target \"");
                            cmAlphaNum::cmAlphaNum(&local_518,input);
                            cmStrCat<char[19],std::__cxx11::string,char[20]>
                                      (&local_4b8,&local_4e8,&local_518,
                                       (char (*) [19])"\" because target \"",local_388,
                                       (char (*) [20])"\" is not a library.");
                            cmExecutionStatus::SetError(pcVar1,&local_4b8);
                            std::__cxx11::string::~string((string *)&local_4b8);
                            args_local._7_1_ = 0;
                          }
                        }
                      }
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2f8,"ALIAS requires exactly one target argument.",
                               &local_2f9);
                    cmExecutionStatus::SetError(pcVar1,&local_2f8);
                    std::__cxx11::string::~string((string *)&local_2f8);
                    std::allocator<char>::~allocator(&local_2f9);
                    args_local._7_1_ = 0;
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2d0,"IMPORTED with ALIAS is not allowed.",&local_2d1);
                  cmExecutionStatus::SetError(pcVar1,&local_2d0);
                  std::__cxx11::string::~string((string *)&local_2d0);
                  std::allocator<char>::~allocator(&local_2d1);
                  args_local._7_1_ = 0;
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2a8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                           &local_2a9);
                cmExecutionStatus::SetError(pcVar1,&local_2a8);
                std::__cxx11::string::~string((string *)&local_2a8);
                std::allocator<char>::~allocator(&local_2a9);
                args_local._7_1_ = 0;
              }
            }
            else {
              std::operator+(&local_288,"Invalid name for ALIAS: ",input);
              cmExecutionStatus::SetError(pcVar1,&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              args_local._7_1_ = 0;
            }
          }
          else if (((s._M_current._5_1_ & 1) == 0) || ((s._M_current._6_1_ & 1) == 0)) {
            local_562 = 0;
            local_563 = 0;
            if ((local_64 == SHARED_LIBRARY) || (local_a19 = 0, local_64 == MODULE_LIBRARY)) {
              this_00 = cmMakefile::GetState(pcStack_60);
              std::allocator<char>::allocator();
              local_562 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_560,"TARGET_SUPPORTS_SHARED_LIBS",&local_561);
              local_563 = 1;
              bVar4 = cmState::GetGlobalPropertyAsBool(this_00,&local_560);
              local_a19 = bVar4 ^ 0xff;
            }
            if ((local_563 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_560);
            }
            if ((local_562 & 1) != 0) {
              std::allocator<char>::~allocator(&local_561);
            }
            pcVar6 = pcStack_60;
            if ((local_a19 & 1) != 0) {
              cmAlphaNum::cmAlphaNum(&local_5b8,"ADD_LIBRARY called with ");
              if (local_64 == SHARED_LIBRARY) {
                local_a48 = "SHARED";
              }
              else {
                local_a48 = "MODULE";
              }
              cmAlphaNum::cmAlphaNum(&local_5e8,local_a48);
              cmStrCat<char[67],char[62]>
                        (&local_588,&local_5b8,&local_5e8,
                         (char (*) [67])
                         " option but the target platform does not support dynamic linking. ",
                         (char (*) [62])
                         "Building a STATIC library instead. This may lead to problems.");
              cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,&local_588);
              std::__cxx11::string::~string((string *)&local_588);
              local_64 = STATIC_LIBRARY;
            }
            pcVar1 = local_20;
            pcVar6 = pcStack_60;
            if ((s._M_current._5_1_ & 1) == 0) {
              if (local_64 == UNKNOWN_LIBRARY) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_730,
                           "The UNKNOWN library type may be used only for IMPORTED libraries.",
                           (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,&local_730);
                std::__cxx11::string::~string((string *)&local_730);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                args_local._7_1_ = 1;
              }
              else {
                std::__cxx11::string::string((string *)local_758);
                bVar2 = cmMakefile::EnforceUniqueName(pcStack_60,input,(string *)local_758,false);
                if (!bVar2) {
                  cmExecutionStatus::SetError(local_20,(string *)local_758);
                  args_local._7_1_ = 0;
                }
                local_100 = (uint)!bVar2;
                std::__cxx11::string::~string((string *)local_758);
                if (local_100 == 0) {
                  if ((local_64 != INTERFACE_LIBRARY) ||
                     ((bVar2 = cmGeneratorExpression::IsValidTargetName(input), bVar2 &&
                      (lVar8 = std::__cxx11::string::find((char *)input,0xc55158), lVar8 == -1)))) {
                    local_7f8._M_current = libName;
                    local_800._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::allocator(&local_801);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_7f0,local_7f8,local_800,&local_801);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~allocator(&local_801);
                    cmMakefile::AddLibrary
                              (pcStack_60,input,local_64,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_7f0,(bool)(s._M_current._6_1_ & 1));
                    args_local._7_1_ = 1;
                    local_100 = 1;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_7f0);
                  }
                  else {
                    pcVar1 = local_20;
                    cmAlphaNum::cmAlphaNum(&local_7a8,"Invalid name for INTERFACE library target: ")
                    ;
                    this = &srcs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)this,input);
                    cmStrCat<>(&local_778,&local_7a8,(cmAlphaNum *)this);
                    cmExecutionStatus::SetError(pcVar1,&local_778);
                    std::__cxx11::string::~string((string *)&local_778);
                    args_local._7_1_ = 0;
                  }
                }
              }
            }
            else if (bVar2) {
              if ((local_64 != INTERFACE_LIBRARY) ||
                 (bVar2 = cmGeneratorExpression::IsValidTargetName(input), pcVar1 = local_20, bVar2)
                 ) {
                pcVar10 = cmMakefile::FindTargetToUse(pcStack_60,input,false);
                pcVar1 = local_20;
                if (pcVar10 == (cmTarget *)0x0) {
                  cmMakefile::AddImportedTarget
                            (pcStack_60,input,local_64,(bool)(s._M_current._4_1_ & 1));
                  args_local._7_1_ = 1;
                }
                else {
                  cmAlphaNum::cmAlphaNum(&local_6e0,"cannot create imported target \"");
                  cmAlphaNum::cmAlphaNum(&local_710,input);
                  cmStrCat<char[60]>(&local_6b0,&local_6e0,&local_710,
                                     (char (*) [60])
                                     "\" because another target with the same name already exists.")
                  ;
                  cmExecutionStatus::SetError(pcVar1,&local_6b0);
                  std::__cxx11::string::~string((string *)&local_6b0);
                  args_local._7_1_ = 0;
                }
              }
              else {
                cmAlphaNum::cmAlphaNum
                          (&local_660,"Invalid name for IMPORTED INTERFACE library target: ");
                cmAlphaNum::cmAlphaNum(&local_690,input);
                cmStrCat<>(&local_630,&local_660,&local_690);
                cmExecutionStatus::SetError(pcVar1,&local_630);
                std::__cxx11::string::~string((string *)&local_630);
                args_local._7_1_ = 0;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_608,"called with IMPORTED argument but no library type.",
                         &local_609);
              cmExecutionStatus::SetError(pcVar1,&local_608);
              std::__cxx11::string::~string((string *)&local_608);
              std::allocator<char>::~allocator(&local_609);
              args_local._7_1_ = 0;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_538,"excludeFromAll with IMPORTED target makes no sense.",
                       &local_539);
            cmExecutionStatus::SetError(pcVar1,&local_538);
            std::__cxx11::string::~string((string *)&local_538);
            std::allocator<char>::~allocator(&local_539);
            args_local._7_1_ = 0;
          }
        }
        else {
          args_local._7_1_ = 0;
        }
      }
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmAddLibraryCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmIsOff(mf.GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  auto s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting STATIC type.");
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting SHARED type.");
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting MODULE type.");
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting OBJECT type.");
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting UNKNOWN type.");
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        status.SetError(
          "INTERFACE library specified with conflicting/multiple types.");
        return false;
      }
      if (isAlias) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      status.SetError(
        "GLOBAL option may only be used with IMPORTED libraries.");
      return false;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (importGlobal && !importTarget) {
      status.SetError(
        "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      status.SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    if (mf.GetPolicyStatus(cmPolicies::CMP0107) == cmPolicies::NEW) {
      // Make sure the target does not already exist.
      if (mf.FindTargetToUse(libName)) {
        status.SetError(cmStrCat(
          "cannot create ALIAS target \"", libName,
          "\" because another target with the same name already exists."));
        return false;
      }
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is not a library."));
      return false;
    }
    mf.AddAlias(libName, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  if (importTarget && excludeFromAll) {
    status.SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !mf.GetState()->GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS")) {
    mf.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        "ADD_LIBRARY called with ",
        (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE"),
        " option but the target platform does not support dynamic linking. ",
        "Building a STATIC library instead. This may lead to problems."));
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      status.SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        status.SetError(cmStrCat(
          "Invalid name for IMPORTED INTERFACE library target: ", libName));
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(libName)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", libName,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(libName, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      status.SetError(
        cmStrCat("Invalid name for INTERFACE library target: ", libName));
      return false;
    }
  }

  std::vector<std::string> srcs(s, args.end());
  mf.AddLibrary(libName, type, srcs, excludeFromAll);

  return true;
}